

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_audio.c
# Opt level: O0

void glob_audio_dialog(t_pd *dummy,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  t_float tVar2;
  undefined1 local_90 [8];
  t_audiosettings as;
  int i;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_pd *dummy_local;
  
  local_90._0_4_ = audio_nextsettings.a_api;
  unique0x1000051e = argv;
  tVar2 = atom_getfloatarg(0x10,argc,argv);
  as.a_choutdevvec[2] = (int)tVar2;
  tVar2 = atom_getfloatarg(0x11,argc,stack0xffffffffffffffd8);
  as.a_choutdevvec[3] = (int)tVar2;
  tVar2 = atom_getfloatarg(0x12,argc,stack0xffffffffffffffd8);
  as.a_srate = (int)tVar2;
  tVar2 = atom_getfloatarg(0x13,argc,stack0xffffffffffffffd8);
  as.a_advance = (int)tVar2;
  for (as.a_callback = 0; as.a_callback < 4; as.a_callback = as.a_callback + 1) {
    tVar2 = atom_getfloatarg(as.a_callback,argc,stack0xffffffffffffffd8);
    as.a_indevvec[(long)as.a_callback + -2] = (int)tVar2;
    tVar2 = atom_getfloatarg(as.a_callback + 4,argc,stack0xffffffffffffffd8);
    as.a_indevvec[(long)as.a_callback + 3] = (int)tVar2;
    tVar2 = atom_getfloatarg(as.a_callback + 8,argc,stack0xffffffffffffffd8);
    as.a_chindevvec[(long)as.a_callback + 3] = (int)tVar2;
    tVar2 = atom_getfloatarg(as.a_callback + 0xc,argc,stack0xffffffffffffffd8);
    as.a_outdevvec[(long)as.a_callback + 3] = (int)tVar2;
  }
  local_90._4_4_ = 0;
  for (as.a_callback = 0; as.a_callback < 4; as.a_callback = as.a_callback + 1) {
    if (as.a_indevvec[(long)as.a_callback + 3] != 0) {
      as.a_indevvec[(long)(int)local_90._4_4_ + -2] = as.a_indevvec[(long)as.a_callback + -2];
      as.a_indevvec[(long)(int)local_90._4_4_ + 3] = as.a_indevvec[(long)as.a_callback + 3];
      local_90._4_4_ = local_90._4_4_ + 1;
    }
  }
  as.a_chindevvec[2] = 0;
  for (as.a_callback = 0; as.a_callback < 4; as.a_callback = as.a_callback + 1) {
    if (as.a_outdevvec[(long)as.a_callback + 3] != 0) {
      as.a_chindevvec[(long)as.a_chindevvec[2] + 3] = as.a_chindevvec[(long)as.a_callback + 3];
      as.a_outdevvec[(long)as.a_chindevvec[2] + 3] = as.a_outdevvec[(long)as.a_callback + 3];
      as.a_chindevvec[2] = as.a_chindevvec[2] + 1;
    }
  }
  as.a_indevvec[2] = local_90._4_4_;
  as.a_outdevvec[2] = as.a_chindevvec[2];
  if (as.a_srate < 0) {
    as.a_srate = 0;
  }
  iVar1 = ilog2(as.a_advance);
  as.a_advance = 1 << ((byte)iVar1 & 0x1f);
  if ((as.a_advance < 0x40) || (0x800 < as.a_advance)) {
    as.a_advance = 0x40;
  }
  if ((audio_callback_is_open == 0) && (as.a_srate == 0)) {
    sys_close_audio();
  }
  sys_set_audio_settings((t_audiosettings *)local_90);
  if ((audio_callback_is_open == 0) && (as.a_srate == 0)) {
    sys_reopen_audio();
  }
  else {
    sched_reopenmeplease();
  }
  return;
}

Assistant:

void glob_audio_dialog(t_pd *dummy, t_symbol *s, int argc, t_atom *argv)
{
    int i;
    t_audiosettings as;
    as.a_api = audio_nextsettings.a_api;
    as.a_srate = atom_getfloatarg(16, argc, argv);
    as.a_advance = atom_getfloatarg(17, argc, argv);
    as.a_callback = atom_getfloatarg(18, argc, argv);
    as.a_blocksize = atom_getfloatarg(19, argc, argv);

    for (i = 0; i < 4; i++)
    {
        as.a_indevvec[i] = atom_getfloatarg(i, argc, argv);
        as.a_chindevvec[i] = atom_getfloatarg(i+4, argc, argv);
        as.a_outdevvec[i] = atom_getfloatarg(i+8, argc, argv);
        as.a_choutdevvec[i] = atom_getfloatarg(i+12, argc, argv);
    }
        /* compact out any zeros and count nonzero entries */
    for (i = 0, as.a_nindev = 0; i < 4; i++)
    {
        if (as.a_chindevvec[i])
        {
            as.a_indevvec[as.a_nindev] = as.a_indevvec[i];
            as.a_chindevvec[as.a_nindev] = as.a_chindevvec[i];
            as.a_nindev++;
        }
    }
    for (i = 0, as.a_noutdev = 0; i < 4; i++)
    {
        if (as.a_choutdevvec[i])
        {
            as.a_outdevvec[as.a_noutdev] = as.a_outdevvec[i];
            as.a_choutdevvec[as.a_noutdev] = as.a_choutdevvec[i];
            as.a_noutdev++;
        }
    }
    as.a_nchindev = as.a_nindev;
    as.a_nchoutdev = as.a_noutdev;
    if (as.a_callback < 0)
        as.a_callback = 0;
    as.a_blocksize = (1<<ilog2(as.a_blocksize));
    if (as.a_blocksize < DEFDACBLKSIZE || as.a_blocksize > MAXBLOCKSIZE)
            as.a_blocksize = DEFDACBLKSIZE;

    if (!audio_callback_is_open && !as.a_callback)
        sys_close_audio();
    sys_set_audio_settings(&as);
    if (!audio_callback_is_open && !as.a_callback)
        sys_reopen_audio();
    else sched_reopenmeplease();
}